

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGenerator::AddGlobalTarget_Test
          (cmGlobalGenerator *this,
          vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
          *targets)

{
  pointer puVar1;
  __uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_> _Var2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  string *__x;
  cmValue list;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  long lVar5;
  allocator<char> local_139;
  string local_138;
  cmCustomCommandLine singleLine;
  cmList args;
  GlobalTargetInfo gti;
  char *__s;
  
  puVar1 = (this->Makefiles).
           super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  _Var2._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
  super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl =
       (puVar1->_M_t).super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gti,"CMAKE_TESTING_ENABLED",(allocator<char> *)&local_138);
  bVar3 = cmMakefile::IsOn((cmMakefile *)
                           _Var2._M_t.
                           super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                           super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,&gti.Name);
  std::__cxx11::string::~string((string *)&gti);
  if (bVar3) {
    lVar5 = 0;
    do {
      if (lVar5 == 0x10) {
        iVar4 = (*this->_vptr_cmGlobalGenerator[0x17])(this);
        __s = (char *)CONCAT44(extraout_var,iVar4);
        gti.Name._M_dataplus._M_p = (pointer)&gti.Name.field_2;
        gti.Name._M_string_length = 0;
        gti.Name.field_2._M_local_buf[0] = '\0';
        gti.Message._M_dataplus._M_p = (pointer)&gti.Message.field_2;
        gti.Message._M_string_length = 0;
        gti.Message.field_2._M_local_buf[0] = '\0';
        gti.WorkingDir._M_dataplus._M_p = (pointer)&gti.WorkingDir.field_2;
        gti.CommandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
        super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        gti.CommandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
        super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        gti.CommandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
        super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        gti.Depends.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        gti.Depends.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        gti.Depends.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        gti.WorkingDir._M_string_length = 0;
        gti.WorkingDir.field_2._M_local_buf[0] = '\0';
        gti.UsesTerminal = false;
        gti.PerConfig = Yes;
        gti.StdPipesUTF8 = false;
        (*this->_vptr_cmGlobalGenerator[0x20])(this);
        std::__cxx11::string::assign((char *)&gti);
        std::__cxx11::string::assign((char *)&gti.Message);
        gti.UsesTerminal = true;
        _Var2._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
        super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl =
             (puVar1->_M_t).super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t
        ;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_138,"CMAKE_SKIP_TEST_ALL_DEPENDENCY",(allocator<char> *)&args);
        singleLine.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)cmMakefile::GetDefinition
                                ((cmMakefile *)
                                 _Var2._M_t.
                                 super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>
                                 .super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,&local_138
                                );
        std::__cxx11::string::~string((string *)&local_138);
        if ((singleLine.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) &&
           (bVar3 = cmValue::IsOff((cmValue *)&singleLine), bVar3)) {
          iVar4 = (*this->_vptr_cmGlobalGenerator[0x1b])();
          local_138._M_dataplus._M_p = (pointer)CONCAT44(extraout_var_00,iVar4);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &gti.Depends,(char **)&local_138);
        }
        singleLine.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        singleLine.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        singleLine.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        __x = cmSystemTools::GetCTestCommand_abi_cxx11_();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&singleLine.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ,__x);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_138,"--force-new-ctest-process",(allocator<char> *)&args);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&singleLine,
                   &local_138);
        std::__cxx11::string::~string((string *)&local_138);
        _Var2._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
        super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl =
             (puVar1->_M_t).super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t
        ;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_138,"CMAKE_CTEST_ARGUMENTS",&local_139);
        list = cmMakefile::GetDefinition
                         ((cmMakefile *)
                          _Var2._M_t.
                          super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                          super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,&local_138);
        cmList::cmList(&args,list,Yes,No);
        std::__cxx11::string::~string((string *)&local_138);
        for (; args.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               args.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
            args.Values.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 args.Values.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&singleLine.
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ,args.Values.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
        }
        if (((__s == (char *)0x0) || (*__s == '\0')) || (*__s == '.')) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_138,"$(ARGS)",&local_139);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &singleLine,&local_138);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"-C",&local_139);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &singleLine,&local_138);
          std::__cxx11::string::~string((string *)&local_138);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,__s,&local_139);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &singleLine,&local_138);
        }
        std::__cxx11::string::~string((string *)&local_138);
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
        emplace_back<cmCustomCommandLine>
                  (&gti.CommandLines.
                    super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                   &singleLine);
        std::
        vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
        ::emplace_back<cmGlobalGenerator::GlobalTargetInfo>(targets,&gti);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&args.Values);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&singleLine.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 );
        GlobalTargetInfo::~GlobalTargetInfo(&gti);
        return;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&gti,
                 *(char **)((long)&AddGlobalTarget_Test(std::vector<cmGlobalGenerator::GlobalTargetInfo,std::allocator<cmGlobalGenerator::GlobalTargetInfo>>&)
                                   ::reservedTargets + lVar5),(allocator<char> *)&singleLine);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,"when CTest testing is enabled",(allocator<char> *)&args);
      bVar3 = CheckCMP0037(this,&gti.Name,&local_138);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&gti);
      lVar5 = lVar5 + 8;
    } while (bVar3);
  }
  return;
}

Assistant:

void cmGlobalGenerator::AddGlobalTarget_Test(
  std::vector<GlobalTargetInfo>& targets)
{
  auto& mf = this->Makefiles[0];
  if (!mf->IsOn("CMAKE_TESTING_ENABLED")) {
    return;
  }

  static const auto reservedTargets = { "test", "RUN_TESTS" };
  for (auto const& target : reservedTargets) {
    if (!this->CheckCMP0037(target, "when CTest testing is enabled")) {
      return;
    }
  }

  const char* cmakeCfgIntDir = this->GetCMakeCFGIntDir();
  GlobalTargetInfo gti;
  gti.Name = this->GetTestTargetName();
  gti.Message = "Running tests...";
  gti.UsesTerminal = true;
  // Unlike the 'install' target, the 'test' target does not depend on 'all'
  // by default.  Enable it only if CMAKE_SKIP_TEST_ALL_DEPENDENCY is
  // explicitly set to OFF.
  if (cmValue noall = mf->GetDefinition("CMAKE_SKIP_TEST_ALL_DEPENDENCY")) {
    if (noall.IsOff()) {
      gti.Depends.emplace_back(this->GetAllTargetName());
    }
  }
  cmCustomCommandLine singleLine;
  singleLine.push_back(cmSystemTools::GetCTestCommand());
  singleLine.push_back("--force-new-ctest-process");
  cmList args(mf->GetDefinition("CMAKE_CTEST_ARGUMENTS"));
  for (auto const& arg : args) {
    singleLine.push_back(arg);
  }
  if (cmNonempty(cmakeCfgIntDir) && cmakeCfgIntDir[0] != '.') {
    singleLine.push_back("-C");
    singleLine.push_back(cmakeCfgIntDir);
  } else // TODO: This is a hack. Should be something to do with the
         // generator
  {
    singleLine.push_back("$(ARGS)");
  }
  gti.CommandLines.push_back(std::move(singleLine));
  targets.push_back(std::move(gti));
}